

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O1

void icu_63::Transliterator::registerFactory(UnicodeString *id,Factory factory,Token context)

{
  UBool UVar1;
  UErrorCode ec;
  UErrorCode ec_1;
  UErrorCode local_20 [2];
  
  umtx_lock_63(&registryMutex);
  local_20[0] = U_ZERO_ERROR;
  if (registry == (TransliteratorRegistry *)0x0) {
    UVar1 = initializeRegistry(local_20);
    if (UVar1 == '\0') goto LAB_002779c1;
  }
  local_20[1] = 0;
  TransliteratorRegistry::put(registry,id,factory,context,'\x01',local_20 + 1);
LAB_002779c1:
  umtx_unlock_63(&registryMutex);
  return;
}

Assistant:

void U_EXPORT2 Transliterator::registerFactory(const UnicodeString& id,
                                     Transliterator::Factory factory,
                                     Transliterator::Token context) {
    Mutex lock(&registryMutex);
    UErrorCode ec = U_ZERO_ERROR;
    if (HAVE_REGISTRY(ec)) {
        _registerFactory(id, factory, context);
    }
}